

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P)

{
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *Y;
  int iVar2;
  mbedtls_mpi S;
  mbedtls_mpi T;
  mbedtls_mpi U;
  mbedtls_mpi M;
  
  dbl_count = dbl_count + 1;
  mbedtls_mpi_init(&M);
  mbedtls_mpi_init(&S);
  mbedtls_mpi_init(&T);
  mbedtls_mpi_init(&U);
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    iVar2 = mbedtls_mpi_mul_mpi(&S,&P->Z,&P->Z);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = mbedtls_mpi_add_mpi(&T,&P->X,&S);
      if (iVar2 == 0) {
        pmVar1 = &grp->P;
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&T,pmVar1);
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_sub_mpi(&U,&P->X,&S);
            if (iVar2 == 0) {
              goto LAB_001643cd;
            }
            break;
          }
          iVar2 = mbedtls_mpi_sub_abs(&T,&T,pmVar1);
        } while (iVar2 == 0);
      }
    }
  }
  else {
    iVar2 = mbedtls_mpi_mul_mpi(&S,&P->X,&P->X);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = mbedtls_mpi_mul_int(&M,&S,3);
      if (iVar2 == 0) {
        pmVar1 = &grp->P;
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&M,pmVar1);
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_cmp_int(&grp->A,0);
            if (iVar2 == 0) goto LAB_0016447a;
            iVar2 = mbedtls_mpi_mul_mpi(&S,&P->Z,&P->Z);
            if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
              mul_count = mul_count + 1;
              iVar2 = mbedtls_mpi_mul_mpi(&T,&S,&S);
              if ((iVar2 == 0) && (iVar2 = ecp_modp(&T,grp), iVar2 == 0)) {
                mul_count = mul_count + 1;
                iVar2 = mbedtls_mpi_mul_mpi(&S,&T,&grp->A);
                if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
                  mul_count = mul_count + 1;
                  iVar2 = mbedtls_mpi_add_mpi(&M,&M,&S);
                  if (iVar2 == 0) {
                    goto LAB_00164382;
                  }
                }
              }
            }
            break;
          }
          iVar2 = mbedtls_mpi_sub_abs(&M,&M,pmVar1);
        } while (iVar2 == 0);
      }
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_add_mpi(&U,&U,pmVar1), iVar2 == 0) {
LAB_001643cd:
    if ((-1 < U.s) || (iVar2 = mbedtls_mpi_cmp_int(&U,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mpi(&S,&T,&U);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_mul_int(&M,&S,3);
        if (iVar2 == 0) {
          goto LAB_00164452;
        }
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_sub_abs(&M,&M,pmVar1), iVar2 == 0) {
LAB_00164452:
    iVar2 = mbedtls_mpi_cmp_mpi(&M,pmVar1);
    if (iVar2 < 0) goto LAB_0016447a;
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_sub_abs(&M,&M,pmVar1), iVar2 == 0) {
LAB_00164382:
    iVar2 = mbedtls_mpi_cmp_mpi(&M,pmVar1);
    if (iVar2 < 0) goto LAB_0016447a;
  }
  goto LAB_00164240;
LAB_0016447a:
  pmVar1 = &P->Y;
  iVar2 = mbedtls_mpi_mul_mpi(&T,pmVar1,pmVar1);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(&T,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    iVar2 = mbedtls_mpi_shift_l(&T,1);
    if (iVar2 == 0) {
      Y = &grp->P;
      do {
        iVar2 = mbedtls_mpi_cmp_mpi(&T,Y);
        if (iVar2 < 0) {
          iVar2 = mbedtls_mpi_mul_mpi(&S,&P->X,&T);
          if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
            mul_count = mul_count + 1;
            iVar2 = mbedtls_mpi_shift_l(&S,1);
            if (iVar2 == 0) {
              goto LAB_00164557;
            }
          }
          break;
        }
        iVar2 = mbedtls_mpi_sub_abs(&T,&T,Y);
      } while (iVar2 == 0);
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_sub_abs(&S,&S,Y), iVar2 == 0) {
LAB_00164557:
    iVar2 = mbedtls_mpi_cmp_mpi(&S,Y);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_mul_mpi(&U,&T,&T);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&U,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_shift_l(&U,1);
        if (iVar2 == 0) {
          goto LAB_001645d4;
        }
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_sub_abs(&U,&U,Y), iVar2 == 0) {
LAB_001645d4:
    iVar2 = mbedtls_mpi_cmp_mpi(&U,Y);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_mul_mpi(&T,&M,&M);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&T,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_sub_mpi(&T,&T,&S);
        if (iVar2 == 0) {
          goto LAB_00164656;
        }
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_add_mpi(&T,&T,Y), iVar2 == 0) {
LAB_00164656:
    if ((-1 < T.s) || (iVar2 = mbedtls_mpi_cmp_int(&T,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_sub_mpi(&T,&T,&S);
      if (iVar2 == 0) {
        goto LAB_001646a5;
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_add_mpi(&T,&T,Y), iVar2 == 0) {
LAB_001646a5:
    if ((-1 < T.s) || (iVar2 = mbedtls_mpi_cmp_int(&T,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_sub_mpi(&S,&S,&T);
      if (iVar2 == 0) {
        goto LAB_001646f4;
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_add_mpi(&S,&S,Y), iVar2 == 0) {
LAB_001646f4:
    if ((-1 < S.s) || (iVar2 = mbedtls_mpi_cmp_int(&S,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mpi(&S,&S,&M);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&S,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_sub_mpi(&S,&S,&U);
        if (iVar2 == 0) {
          goto LAB_00164779;
        }
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_add_mpi(&S,&S,Y), iVar2 == 0) {
LAB_00164779:
    if ((-1 < S.s) || (iVar2 = mbedtls_mpi_cmp_int(&S,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mpi(&U,pmVar1,&P->Z);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&U,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_shift_l(&U,1);
        if (iVar2 == 0) {
          goto LAB_00164802;
        }
      }
      break;
    }
  }
  goto LAB_00164240;
  while (iVar2 = mbedtls_mpi_sub_abs(&U,&U,Y), iVar2 == 0) {
LAB_00164802:
    iVar2 = mbedtls_mpi_cmp_mpi(&U,Y);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&R->X,&T);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&R->Y,&S), iVar2 == 0)) {
        iVar2 = mbedtls_mpi_copy(&R->Z,&U);
      }
      break;
    }
  }
LAB_00164240:
  mbedtls_mpi_free(&M);
  mbedtls_mpi_free(&S);
  mbedtls_mpi_free(&T);
  mbedtls_mpi_free(&U);
  return iVar2;
}

Assistant:

static int ecp_double_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point *P )
{
    int ret;
    mbedtls_mpi M, S, T, U;

#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

    mbedtls_mpi_init( &M ); mbedtls_mpi_init( &S ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &U );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        /* M = 3(X + Z^2)(X - Z^2) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->Z,  &P->Z   ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T,  &P->X,  &S      ) ); MOD_ADD( T );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U,  &P->X,  &S      ) ); MOD_SUB( U );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &T,     &U      ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );
    }
    else
    {
        /* M = 3.X^2 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->X,  &P->X   ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );

        /* Optimize away for "koblitz" curves with A = 0 */
        if( mbedtls_mpi_cmp_int( &grp->A, 0 ) != 0 )
        {
            /* M += A.Z^4 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->Z,  &P->Z   ) ); MOD_MUL( S );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &S,     &S      ) ); MOD_MUL( T );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &T,     &grp->A ) ); MOD_MUL( S );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &M,  &M,     &S      ) ); MOD_ADD( M );
        }
    }

    /* S = 4.X.Y^2 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &P->Y,  &P->Y   ) ); MOD_MUL( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T,  1               ) ); MOD_ADD( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->X,  &T      ) ); MOD_MUL( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &S,  1               ) ); MOD_ADD( S );

    /* U = 8.Y^4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &U,  &T,     &T      ) ); MOD_MUL( U );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &U,  1               ) ); MOD_ADD( U );

    /* T = M^2 - 2.S */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &M,     &M      ) ); MOD_MUL( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T,  &T,     &S      ) ); MOD_SUB( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T,  &T,     &S      ) ); MOD_SUB( T );

    /* S = M(S - T) - U */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S,  &S,     &T      ) ); MOD_SUB( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &S,     &M      ) ); MOD_MUL( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S,  &S,     &U      ) ); MOD_SUB( S );

    /* U = 2.Y.Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &U,  &P->Y,  &P->Z   ) ); MOD_MUL( U );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &U,  1               ) ); MOD_ADD( U );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &T ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &S ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &U ) );

cleanup:
    mbedtls_mpi_free( &M ); mbedtls_mpi_free( &S ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &U );

    return( ret );
}